

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void printSourceLine(raw_ostream *S,StringRef LineContents)

{
  char cVar1;
  uint local_34;
  uint OutCol;
  uint e;
  uint i;
  raw_ostream *S_local;
  StringRef LineContents_local;
  
  LineContents_local.Data = (char *)LineContents.Length;
  S_local = (raw_ostream *)LineContents.Data;
  LineContents_local.Length = (size_t)&S_local;
  local_34 = 0;
  for (OutCol = 0; OutCol != (uint)LineContents.Length; OutCol = OutCol + 1) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)&S_local,(ulong)OutCol);
    if (cVar1 == '\t') {
      do {
        llvm::raw_ostream::operator<<(S,' ');
        local_34 = local_34 + 1;
      } while ((local_34 & 7) != 0);
    }
    else {
      cVar1 = llvm::StringRef::operator[]((StringRef *)&S_local,(ulong)OutCol);
      llvm::raw_ostream::operator<<(S,cVar1);
      local_34 = local_34 + 1;
    }
  }
  llvm::raw_ostream::operator<<(S,'\n');
  return;
}

Assistant:

static void printSourceLine(raw_ostream &S, StringRef LineContents) {
  // Print out the source line one character at a time, so we can expand tabs.
  for (unsigned i = 0, e = LineContents.size(), OutCol = 0; i != e; ++i) {
    if (LineContents[i] != '\t') {
      S << LineContents[i];
      ++OutCol;
      continue;
    }

    // If we have a tab, emit at least one space, then round up to 8 columns.
    do {
      S << ' ';
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';
}